

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O2

argument * __thiscall
argParserAdvancedConfiguration::getArgument(argParserAdvancedConfiguration *this,string *param)

{
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *this_00;
  value_type psVar1;
  vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
  *this_01;
  value_type __lhs;
  bool bVar2;
  __type _Var3;
  reference ppsVar4;
  reference ppaVar5;
  int argIndex;
  ulong __n;
  int secIndex;
  ulong __n_00;
  
  __n_00 = 0;
  do {
    this_00 = this->newargconfig;
    if ((ulong)((long)(this_00->
                      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->
                      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= __n_00) {
      std::__cxx11::string::_M_assign((string *)&this->lastFailedArg);
      return (argument *)0x0;
    }
    ppsVar4 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::at(this_00,__n_00);
    psVar1 = *ppsVar4;
    for (__n = 0; this_01 = psVar1->arguments,
        __n < (ulong)((long)(this_01->
                            super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_01->
                            super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
      ppaVar5 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at(this_01,__n);
      __lhs = *ppaVar5;
      bVar2 = std::operator!=(param,"");
      if (bVar2) {
        _Var3 = std::operator==(&__lhs->argShort,param);
        if (_Var3) {
          return __lhs;
        }
        _Var3 = std::operator==(&__lhs->argLong,param);
        if (_Var3) {
          return __lhs;
        }
      }
    }
    __n_00 = __n_00 + 1;
  } while( true );
}

Assistant:

argParserAdvancedConfiguration::argument * argParserAdvancedConfiguration::getArgument(string param){

    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++)
    {
        section * sec;
        sec = newargconfig->at(secIndex);

        for(int argIndex = 0; argIndex < sec->arguments->size();argIndex++) {
            argument * arg = sec->arguments->at(argIndex);
                if (param != "" && (arg->argShort == param || arg->argLong == param)) {
                    return arg;
                }
            }
    }
    lastFailedArg = param;
    return nullptr;
}